

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O0

bool __thiscall NNTreeIterator::operator==(NNTreeIterator *this,NNTreeIterator *other)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  pointer pPVar5;
  _Self local_38;
  _List_const_iterator<NNTreeIterator::PathElement> local_30;
  const_iterator opi;
  const_iterator tpi;
  NNTreeIterator *other_local;
  NNTreeIterator *this_local;
  
  if ((this->item_number == -1) && (other->item_number == -1)) {
    this_local._7_1_ = true;
  }
  else {
    sVar3 = std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::size
                      (&this->path);
    sVar4 = std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::size
                      (&other->path);
    if (sVar3 == sVar4) {
      opi = std::__cxx11::
            list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::begin
                      (&this->path);
      local_30._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::begin
                     (&other->path);
      while( true ) {
        local_38._M_node =
             (_List_node_base *)
             std::__cxx11::
             list<NNTreeIterator::PathElement,_std::allocator<NNTreeIterator::PathElement>_>::end
                       (&this->path);
        bVar2 = std::operator!=(&opi,&local_38);
        if (!bVar2) break;
        pPVar5 = std::_List_const_iterator<NNTreeIterator::PathElement>::operator->(&opi);
        iVar1 = pPVar5->kid_number;
        pPVar5 = std::_List_const_iterator<NNTreeIterator::PathElement>::operator->(&local_30);
        if (iVar1 != pPVar5->kid_number) {
          return false;
        }
        std::_List_const_iterator<NNTreeIterator::PathElement>::operator++(&opi);
        std::_List_const_iterator<NNTreeIterator::PathElement>::operator++(&local_30);
      }
      if (this->item_number == other->item_number) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool
NNTreeIterator::operator==(NNTreeIterator const& other) const
{
    if ((this->item_number == -1) && (other.item_number == -1)) {
        return true;
    }
    if (this->path.size() != other.path.size()) {
        return false;
    }
    auto tpi = this->path.begin();
    auto opi = other.path.begin();
    while (tpi != this->path.end()) {
        if (tpi->kid_number != opi->kid_number) {
            return false;
        }
        ++tpi;
        ++opi;
    }
    if (this->item_number != other.item_number) {
        return false;
    }
    return true;
}